

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> * __thiscall
density::
lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
::
start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
          (reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>
           *__return_storage_ptr__,
          lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
          *this,TestObject<256UL,_128UL> *i_construction_params)

{
  uintptr_t uint_pointer;
  InstanceCounted *this_00;
  Allocation push_data;
  Allocation local_38;
  
  detail::
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,256ul,128ul>
            (&local_38,this);
  this_00 = (InstanceCounted *)(local_38.m_control_block + 1);
  density_tests::InstanceCounted::new_instance(this_00);
  *(undefined1 **)this_00 =
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<256ul,128ul>>
       ::s_table;
  density_tests::TestObject<256UL,_128UL>::TestObject
            ((TestObject<256UL,_128UL> *)local_38.m_user_storage,i_construction_params);
  (__return_storage_ptr__->m_put).m_control_block = local_38.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_38.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_38.m_user_storage;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }